

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstruct.cpp
# Opt level: O0

void __thiscall
TPZDohrSubstruct<float>::ContributeTestV1
          (TPZDohrSubstruct<float> *this,TPZFMatrix<float> *testV1,int NumCoarse)

{
  float fVar1;
  long lVar2;
  int64_t iVar3;
  TPZFMatrix<float> *A;
  float *pfVar4;
  int in_EDX;
  int64_t in_RSI;
  long in_RDI;
  TPZFMatrix<float> temp2;
  TPZFMatrix<float> col;
  int j;
  int i;
  TPZFMatrix<float> temp1;
  int64_t in_stack_fffffffffffffd70;
  int *in_stack_fffffffffffffd78;
  TPZFMatrix<float> *in_stack_fffffffffffffd80;
  int64_t in_stack_fffffffffffffd90;
  int64_t in_stack_fffffffffffffd98;
  TPZFMatrix<float> *in_stack_fffffffffffffda0;
  float *in_stack_fffffffffffffda8;
  int64_t in_stack_fffffffffffffdb0;
  int64_t in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdc0;
  float in_stack_fffffffffffffdc4;
  TPZFMatrix<float> *in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdd0;
  float in_stack_fffffffffffffdd4;
  TPZFMatrix<float> *in_stack_fffffffffffffdd8;
  TPZMatrix<float> *in_stack_fffffffffffffde0;
  TPZBaseMatrix local_1e0 [9];
  int local_b0;
  int local_ac;
  TPZBaseMatrix local_a8 [4];
  int local_14;
  int64_t local_10;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  TPZVec<int>::NElements((TPZVec<int> *)(in_RDI + 0x490));
  TPZFMatrix<float>::TPZFMatrix
            (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
  local_ac = 0;
  while( true ) {
    lVar2 = (long)local_ac;
    iVar3 = TPZBaseMatrix::Rows((TPZBaseMatrix *)(in_RDI + 0x370));
    if (iVar3 <= lVar2) break;
    local_b0 = 0;
    while( true ) {
      lVar2 = (long)local_b0;
      iVar3 = TPZBaseMatrix::Cols((TPZBaseMatrix *)(in_RDI + 0x370));
      if (iVar3 <= lVar2) break;
      in_stack_fffffffffffffde0 =
           (TPZMatrix<float> *)
           TPZFMatrix<float>::operator()
                     (in_stack_fffffffffffffd80,(int64_t)in_stack_fffffffffffffd78,
                      in_stack_fffffffffffffd70);
      in_stack_fffffffffffffdd4 =
           *(float *)&(in_stack_fffffffffffffde0->super_TPZBaseMatrix).super_TPZSavable.
                      _vptr_TPZSavable;
      in_stack_fffffffffffffdd8 =
           (TPZFMatrix<float> *)
           TPZVec<float>::operator[]((TPZVec<float> *)(in_RDI + 0x4b0),(long)local_ac);
      in_stack_fffffffffffffdc4 =
           in_stack_fffffffffffffdd4 *
           *(float *)&(in_stack_fffffffffffffdd8->super_TPZMatrix<float>).super_TPZBaseMatrix.
                      super_TPZSavable._vptr_TPZSavable;
      in_stack_fffffffffffffdc8 =
           (TPZFMatrix<float> *)
           TPZFMatrix<float>::operator()
                     (in_stack_fffffffffffffd80,(int64_t)in_stack_fffffffffffffd78,
                      in_stack_fffffffffffffd70);
      *(float *)&(in_stack_fffffffffffffdc8->super_TPZMatrix<float>).super_TPZBaseMatrix.
                 super_TPZSavable._vptr_TPZSavable = in_stack_fffffffffffffdc4;
      local_b0 = local_b0 + 1;
    }
    local_ac = local_ac + 1;
  }
  TPZFMatrix<float>::TPZFMatrix
            (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
  TPZFMatrix<float>::TPZFMatrix
            ((TPZFMatrix<float> *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
             in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  local_ac = 0;
  while( true ) {
    A = (TPZFMatrix<float> *)(long)local_ac;
    iVar3 = TPZVec<int>::NElements((TPZVec<int> *)(in_RDI + 0x490));
    if (iVar3 <= (long)A) break;
    TPZBaseMatrix::Rows(local_a8);
    TPZMatrix<float>::GetSub
              (&in_stack_fffffffffffffdd8->super_TPZMatrix<float>,
               CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
               (int64_t)in_stack_fffffffffffffdc8,
               CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),iVar3,A);
    TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 0x490),(long)local_ac);
    TPZMatrix<float>::PutSub
              (in_stack_fffffffffffffde0,(int64_t)in_stack_fffffffffffffdd8,
               CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
               in_stack_fffffffffffffdc8);
    local_ac = local_ac + 1;
  }
  TPZFMatrix<float>::Resize
            (in_stack_fffffffffffffdd8,CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0)
             ,(int64_t)in_stack_fffffffffffffdc8);
  for (local_ac = 0; local_ac < *(int *)(in_RDI + 0x2b8); local_ac = local_ac + 1) {
    TPZBaseMatrix::Cols(local_1e0);
    TPZMatrix<float>::GetSub
              (&in_stack_fffffffffffffdd8->super_TPZMatrix<float>,
               CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
               (int64_t)in_stack_fffffffffffffdc8,
               CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),iVar3,A);
    for (local_b0 = 0; local_b0 < local_14; local_b0 = local_b0 + 1) {
      in_stack_fffffffffffffd80 =
           (TPZFMatrix<float> *)
           TPZFMatrix<float>::operator()
                     (in_stack_fffffffffffffd80,(int64_t)in_stack_fffffffffffffd78,
                      in_stack_fffffffffffffd70);
      fVar1 = *(float *)&(in_stack_fffffffffffffd80->super_TPZMatrix<float>).super_TPZBaseMatrix.
                         super_TPZSavable._vptr_TPZSavable;
      in_stack_fffffffffffffd70 = local_10;
      in_stack_fffffffffffffd78 =
           TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 0x590),(long)local_ac);
      pfVar4 = TPZFMatrix<float>::operator()
                         (in_stack_fffffffffffffd80,(int64_t)in_stack_fffffffffffffd78,
                          in_stack_fffffffffffffd70);
      *pfVar4 = fVar1 + *pfVar4;
    }
  }
  TPZFMatrix<float>::~TPZFMatrix((TPZFMatrix<float> *)0x1fe74d6);
  TPZFMatrix<float>::~TPZFMatrix((TPZFMatrix<float> *)0x1fe74e3);
  TPZFMatrix<float>::~TPZFMatrix((TPZFMatrix<float> *)0x1fe74f0);
  return;
}

Assistant:

void TPZDohrSubstruct<TVar>::ContributeTestV1(TPZFMatrix<TVar> &testV1, int NumCoarse) {
	/* temp1 will be equal to W(i)*Phi(i) */
	TPZFMatrix<TVar> temp1(fNEquations,fCoarseIndex.NElements());
	int i,j;
	for(i=0;i<fPhiC.Rows();i++) {
		for(j=0;j<fPhiC.Cols();j++) {
			temp1(i,j) = fPhiC(i,j)*fWeights[i];
		}
	}
	/* And now temp2 will be equal to temp1*R(ci) */
	TPZFMatrix<TVar> col(fNEquations,1);
	TPZFMatrix<TVar> temp2(fNEquations,NumCoarse,0.);
	for(i=0;i<fCoarseIndex.NElements();i++) {
		temp1.GetSub(0,i,temp1.Rows(),1,col);
		temp2.PutSub(0,fCoarseIndex[i],col);
	}
	/* And testV1 will be equal to R(i)_trans*temp2 */
	col.Resize(1,NumCoarse);
	for(i=0;i<fNEquations;i++) {
		temp2.GetSub(i,0,1,temp2.Cols(),col);
		//testV1.PutSub(fGlobalIndex[i],0,col);
		for(j=0;j<NumCoarse;j++) {
			testV1(fGlobalIndex[i],j) += col(0,j);
		}
	}
}